

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::MergeFrom
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *from)

{
  uint32_t uVar1;
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  BayesianProbitRegressor_FeatureWeight *local_18;
  BayesianProbitRegressor_FeatureWeight *from_local;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x2cb);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::MergeFrom
            (&this->weights_,&local_18->weights_);
  uVar1 = _internal_featureid(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_featureid(local_18);
    _internal_set_featureid(this,uVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::MergeFrom(const BayesianProbitRegressor_FeatureWeight& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  weights_.MergeFrom(from.weights_);
  if (from._internal_featureid() != 0) {
    _internal_set_featureid(from._internal_featureid());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}